

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall re2::DFA::DFA(DFA *this,Prog *prog,MatchKind kind,int64_t max_mem)

{
  int iVar1;
  Prog *pPVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  Workq *pWVar6;
  int *piVar7;
  _Tuple_impl<1UL,_re2::PODArray<int>::Deleter> _Var8;
  new_allocator<int> local_51;
  StateSet *local_50;
  Mutex *local_48;
  Mutex *local_40;
  Workq **local_38;
  
  this->prog_ = prog;
  this->kind_ = kind;
  this->init_failed_ = false;
  iVar4 = pthread_rwlock_init((pthread_rwlock_t *)&this->mutex_,(pthread_rwlockattr_t *)0x0);
  if (iVar4 == 0) {
    *(undefined8 *)
     &(this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> = 0;
    (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    this->q0_ = (Workq *)0x0;
    this->q1_ = (Workq *)0x0;
    iVar4 = pthread_rwlock_init((pthread_rwlock_t *)&this->cache_mutex_,(pthread_rwlockattr_t *)0x0)
    ;
    if (iVar4 == 0) {
      local_38 = &this->q0_;
      this->mem_budget_ = max_mem;
      local_50 = &this->state_cache_;
      (this->state_cache_)._M_h._M_buckets = &(this->state_cache_)._M_h._M_single_bucket;
      (this->state_cache_)._M_h._M_bucket_count = 1;
      (this->state_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (this->state_cache_)._M_h._M_element_count = 0;
      (this->state_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (this->state_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
      (this->state_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      lVar5 = 0xf0;
      do {
        *(undefined8 *)((long)this + lVar5 + -8) = 0;
        *(undefined4 *)((long)&this->prog_ + lVar5) = 0xffffffff;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x170);
      iVar4 = 0;
      if (this->kind_ == kLongestMatch) {
        iVar4 = this->prog_->size_;
      }
      pPVar2 = this->prog_;
      _Var8.super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_ =
           (_Head_base<1UL,_re2::PODArray<int>::Deleter,_false>)
           (pPVar2->inst_count_[6] + pPVar2->inst_count_[3] + iVar4 + pPVar2->inst_count_[4] + 1);
      this->mem_budget_ = max_mem + -0x168;
      lVar5 = (max_mem + -0x168) -
              (((long)pPVar2->size_ + (long)iVar4) * 0x10 +
              (long)(int)_Var8.super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>.
                         _M_head_impl.len_ * 4);
      this->mem_budget_ = lVar5;
      if ((-1 < lVar5) &&
         (this->state_budget_ = lVar5,
         (((long)pPVar2->list_count_ + (long)iVar4) * 4 + (long)pPVar2->bytemap_range_ * 8) * 0x14 +
         0x1e0 <= lVar5)) {
        local_48 = &this->mutex_;
        local_40 = &this->cache_mutex_;
        pWVar6 = (Workq *)operator_new(0x38);
        iVar1 = pPVar2->size_;
        SparseSetT<void>::SparseSetT((SparseSetT<void> *)pWVar6,iVar1 + iVar4);
        pWVar6->n_ = iVar1;
        pWVar6->maxmark_ = iVar4;
        pWVar6->nextmark_ = iVar1;
        pWVar6->last_was_mark_ = true;
        *local_38 = pWVar6;
        pWVar6 = (Workq *)operator_new(0x38);
        iVar1 = this->prog_->size_;
        SparseSetT<void>::SparseSetT((SparseSetT<void> *)pWVar6,iVar1 + iVar4);
        pWVar6->n_ = iVar1;
        pWVar6->maxmark_ = iVar4;
        pWVar6->nextmark_ = iVar1;
        pWVar6->last_was_mark_ = true;
        this->q1_ = pWVar6;
        piVar7 = __gnu_cxx::new_allocator<int>::allocate
                           (&local_51,
                            (long)(int)_Var8.
                                       super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>.
                                       _M_head_impl.len_,(void *)0x0);
        piVar3 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar7;
        if (piVar3 != (int *)0x0) {
          operator_delete(piVar3);
        }
        (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
        super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> =
             _Var8.super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_;
        return;
      }
      this->init_failed_ = true;
      return;
    }
  }
  abort();
}

Assistant:

DFA::DFA(Prog* prog, Prog::MatchKind kind, int64_t max_mem)
  : prog_(prog),
    kind_(kind),
    init_failed_(false),
    q0_(NULL),
    q1_(NULL),
    mem_budget_(max_mem) {
  if (ExtraDebug)
    fprintf(stderr, "\nkind %d\n%s\n", (int)kind_, prog_->DumpUnanchored().c_str());
  int nmark = 0;
  if (kind_ == Prog::kLongestMatch)
    nmark = prog_->size();
  // See DFA::AddToQueue() for why this is so.
  int nstack = prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) +
               nmark + 1;  // + 1 for start inst

  // Account for space needed for DFA, q0, q1, stack.
  mem_budget_ -= sizeof(DFA);
  mem_budget_ -= (prog_->size() + nmark) *
                 (sizeof(int)+sizeof(int)) * 2;  // q0, q1
  mem_budget_ -= nstack * sizeof(int);  // stack
  if (mem_budget_ < 0) {
    init_failed_ = true;
    return;
  }

  state_budget_ = mem_budget_;

  // Make sure there is a reasonable amount of working room left.
  // At minimum, the search requires room for two states in order
  // to limp along, restarting frequently.  We'll get better performance
  // if there is room for a larger number of states, say 20.
  // Note that a state stores list heads only, so we use the program
  // list count for the upper bound, not the program size.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int64_t one_state = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
                      (prog_->list_count()+nmark)*sizeof(int);
  if (state_budget_ < 20*one_state) {
    init_failed_ = true;
    return;
  }

  q0_ = new Workq(prog_->size(), nmark);
  q1_ = new Workq(prog_->size(), nmark);
  stack_ = PODArray<int>(nstack);
}